

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_exptmod_fast(mp_int *G,mp_int *X,mp_int *P,mp_int *Y,int redmode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  mp_int *in_RCX;
  mp_int *in_RDX;
  mp_int *in_RSI;
  int in_R8D;
  _func_int_mp_int_ptr_mp_int_ptr_mp_digit *redux;
  int winsize;
  int y;
  int x;
  int digidx;
  int mode;
  int bitcnt;
  int bitcpy;
  int bitbuf;
  int err;
  mp_digit mp;
  mp_digit buf;
  mp_int res;
  mp_int M [256];
  mp_int *in_stack_ffffffffffffe768;
  code *in_stack_ffffffffffffe770;
  undefined4 in_stack_ffffffffffffe778;
  uint in_stack_ffffffffffffe780;
  int iVar4;
  undefined4 in_stack_ffffffffffffe788;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffe78c;
  int iVar6;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffe790;
  int iVar8;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffe794;
  int iVar10;
  uint in_stack_ffffffffffffe798;
  uint uVar11;
  mp_digit local_1860;
  mp_digit local_1858;
  mp_int local_1850;
  undefined1 local_1838 [6156];
  int local_2c;
  mp_int *local_28;
  mp_int *local_20;
  mp_int *local_18;
  
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  iVar1 = mp_count_bits(in_RSI);
  if (iVar1 < 8) {
    iVar1 = 2;
  }
  else if (iVar1 < 0x25) {
    iVar1 = 3;
  }
  else if (iVar1 < 0x8d) {
    iVar1 = 4;
  }
  else if (iVar1 < 0x1c3) {
    iVar1 = 5;
  }
  else if (iVar1 < 0x518) {
    iVar1 = 6;
  }
  else if (iVar1 < 0xdca) {
    iVar1 = 7;
  }
  else {
    iVar1 = 8;
  }
  iVar2 = mp_init(in_stack_ffffffffffffe768);
  if (iVar2 != 0) {
    return iVar2;
  }
  for (iVar2 = 1 << ((char)iVar1 - 1U & 0x1f); iVar2 < 1 << ((byte)iVar1 & 0x1f); iVar2 = iVar2 + 1)
  {
    iVar3 = mp_init(in_stack_ffffffffffffe768);
    if (iVar3 != 0) {
      for (iVar1 = 1 << ((char)iVar1 - 1U & 0x1f); iVar1 < iVar2; iVar1 = iVar1 + 1) {
        mp_clear((mp_int *)in_stack_ffffffffffffe770);
      }
      mp_clear((mp_int *)in_stack_ffffffffffffe770);
      return iVar3;
    }
  }
  if (local_2c == 0) {
    iVar3 = mp_montgomery_setup(local_20,&local_1860);
    if (iVar3 != 0) goto LAB_0010be50;
    if ((local_20->used * 2 + 1 < 0x200) && (local_20->used < 0x100)) {
      in_stack_ffffffffffffe770 = fast_mp_montgomery_reduce;
    }
    else {
      in_stack_ffffffffffffe770 = mp_montgomery_reduce;
    }
  }
  else if (local_2c == 1) {
    mp_dr_setup(local_20,&local_1860);
    in_stack_ffffffffffffe770 = mp_dr_reduce;
  }
  else {
    iVar3 = mp_reduce_2k_setup((mp_int *)
                               CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788),
                               (mp_digit *)CONCAT44(iVar2,in_stack_ffffffffffffe780));
    if (iVar3 != 0) goto LAB_0010be50;
    in_stack_ffffffffffffe770 = mp_reduce_2k;
  }
  iVar3 = mp_init(in_stack_ffffffffffffe768);
  if (iVar3 != 0) goto LAB_0010be50;
  if (local_2c == 0) {
    iVar3 = mp_montgomery_calc_normalization
                      ((mp_int *)CONCAT44(iVar1,in_stack_ffffffffffffe778),
                       (mp_int *)in_stack_ffffffffffffe770);
    if (iVar3 != 0) goto LAB_0010be46;
    iVar3 = mp_mulmod((mp_int *)(ulong)in_stack_ffffffffffffe798,
                      (mp_int *)CONCAT44(in_stack_ffffffffffffe794,in_stack_ffffffffffffe790),
                      (mp_int *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788),
                      (mp_int *)CONCAT44(iVar2,in_stack_ffffffffffffe780));
  }
  else {
    mp_set((mp_int *)in_stack_ffffffffffffe770,(mp_digit)in_stack_ffffffffffffe768);
    iVar3 = mp_mod((mp_int *)CONCAT44(iVar3,in_stack_ffffffffffffe798),
                   (mp_int *)CONCAT44(in_stack_ffffffffffffe794,in_stack_ffffffffffffe790),
                   (mp_int *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788));
  }
  if ((iVar3 == 0) &&
     (iVar3 = mp_copy((mp_int *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788),
                      (mp_int *)CONCAT44(iVar2,in_stack_ffffffffffffe780)), iVar3 == 0)) {
    for (iVar2 = 0; iVar2 < iVar1 + -1; iVar2 = iVar2 + 1) {
      iVar3 = mp_sqr((mp_int *)in_stack_ffffffffffffe770,in_stack_ffffffffffffe768);
      if ((iVar3 != 0) ||
         (iVar3 = (*in_stack_ffffffffffffe770)
                            (local_1838 + (long)(1 << ((char)iVar1 - 1U & 0x1f)) * 0x18,local_20,
                             local_1860), iVar3 != 0)) goto LAB_0010be46;
    }
    iVar2 = 1 << ((char)iVar1 - 1U & 0x1f);
    do {
      iVar2 = iVar2 + 1;
      if (1 << ((byte)iVar1 & 0x1f) <= iVar2) {
        iVar6 = 0;
        iVar8 = 1;
        local_1858 = 0;
        iVar2 = local_18->used + -1;
        iVar10 = 0;
        uVar11 = 0;
        goto LAB_0010bb3a;
      }
      iVar3 = mp_mul((mp_int *)CONCAT44(in_stack_ffffffffffffe794,in_stack_ffffffffffffe790),
                     (mp_int *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788),
                     (mp_int *)CONCAT44(iVar2,in_stack_ffffffffffffe780));
    } while ((iVar3 == 0) &&
            (iVar3 = (*in_stack_ffffffffffffe770)
                               (local_1838 + (long)iVar2 * 0x18,local_20,local_1860), iVar3 == 0));
  }
LAB_0010be46:
  mp_clear((mp_int *)in_stack_ffffffffffffe770);
LAB_0010be50:
  mp_clear((mp_int *)in_stack_ffffffffffffe770);
  for (iVar2 = 1 << ((char)iVar1 - 1U & 0x1f); iVar2 < 1 << ((byte)iVar1 & 0x1f); iVar2 = iVar2 + 1)
  {
    mp_clear((mp_int *)in_stack_ffffffffffffe770);
  }
  return iVar3;
LAB_0010bb3a:
  do {
    iVar8 = iVar8 + -1;
    if (iVar8 == 0) {
      if (iVar2 == -1) {
        if ((iVar6 != 2) || (iVar10 < 1)) goto LAB_0010bdfc;
        iVar2 = 0;
        uVar9 = 0;
        uVar5 = 0xffffffff;
        uVar7 = 2;
        goto LAB_0010bd2c;
      }
      local_1858 = local_18->dp[iVar2];
      iVar8 = 0x3c;
      iVar2 = iVar2 + -1;
    }
    in_stack_ffffffffffffe780 = (uint)(local_1858 >> 0x3b) & 1;
    local_1858 = local_1858 << 1;
  } while ((iVar6 == 0) && (in_stack_ffffffffffffe780 == 0));
  if ((iVar6 != 1) || (in_stack_ffffffffffffe780 != 0)) {
    iVar10 = iVar10 + 1;
    uVar11 = in_stack_ffffffffffffe780 << ((char)iVar1 - (char)iVar10 & 0x1fU) | uVar11;
    iVar6 = 2;
    if (iVar10 == iVar1) {
      for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
        iVar3 = mp_sqr((mp_int *)in_stack_ffffffffffffe770,in_stack_ffffffffffffe768);
        if ((iVar3 != 0) ||
           (iVar3 = (*in_stack_ffffffffffffe770)(&local_1850,local_20,local_1860), iVar3 != 0))
        goto LAB_0010be46;
      }
      iVar3 = mp_mul((mp_int *)CONCAT44(iVar10,iVar8),(mp_int *)CONCAT44(iVar6,iVar2),
                     (mp_int *)CONCAT44(iVar4,in_stack_ffffffffffffe780));
      if ((iVar3 != 0) ||
         (iVar3 = (*in_stack_ffffffffffffe770)(&local_1850,local_20,local_1860), iVar3 != 0))
      goto LAB_0010be46;
      iVar10 = 0;
      uVar11 = 0;
      iVar6 = 1;
    }
    goto LAB_0010bb3a;
  }
  iVar3 = mp_sqr((mp_int *)in_stack_ffffffffffffe770,in_stack_ffffffffffffe768);
  if ((iVar3 != 0) ||
     (iVar3 = (*in_stack_ffffffffffffe770)(&local_1850,local_20,local_1860), iVar3 != 0))
  goto LAB_0010be46;
  goto LAB_0010bb3a;
LAB_0010bd2c:
  if (iVar10 <= iVar2) goto LAB_0010bdfc;
  iVar3 = mp_sqr((mp_int *)in_stack_ffffffffffffe770,in_stack_ffffffffffffe768);
  if (((iVar3 != 0) ||
      (iVar3 = (*in_stack_ffffffffffffe770)(&local_1850,local_20,local_1860), iVar3 != 0)) ||
     ((uVar11 = uVar11 << 1, (uVar11 & 1 << ((byte)iVar1 & 0x1f)) != 0 &&
      ((iVar3 = mp_mul((mp_int *)CONCAT44(iVar10,uVar9),(mp_int *)CONCAT44(uVar7,uVar5),
                       (mp_int *)CONCAT44(iVar2,in_stack_ffffffffffffe780)), iVar3 != 0 ||
       (iVar3 = (*in_stack_ffffffffffffe770)(&local_1850,local_20,local_1860), iVar3 != 0))))))
  goto LAB_0010be46;
  iVar2 = iVar2 + 1;
  goto LAB_0010bd2c;
LAB_0010bdfc:
  if ((local_2c != 0) ||
     (iVar3 = (*in_stack_ffffffffffffe770)(&local_1850,local_20,local_1860), iVar3 == 0)) {
    mp_exch(&local_1850,local_28);
    iVar3 = 0;
  }
  goto LAB_0010be46;
}

Assistant:

int mp_exptmod_fast (mp_int * G, mp_int * X, mp_int * P, mp_int * Y, int redmode)
{
  mp_int  M[TAB_SIZE], res;
  mp_digit buf, mp;
  int     err, bitbuf, bitcpy, bitcnt, mode, digidx, x, y, winsize;

  /* use a pointer to the reduction algorithm.  This allows us to use
   * one of many reduction algorithms without modding the guts of
   * the code with if statements everywhere.
   */
  int     (*redux)(mp_int*,mp_int*,mp_digit);

  /* find window size */
  x = mp_count_bits (X);
  if (x <= 7) {
    winsize = 2;
  } else if (x <= 36) {
    winsize = 3;
  } else if (x <= 140) {
    winsize = 4;
  } else if (x <= 450) {
    winsize = 5;
  } else if (x <= 1303) {
    winsize = 6;
  } else if (x <= 3529) {
    winsize = 7;
  } else {
    winsize = 8;
  }

  /* init M array */
  /* init first cell */
  if ((err = mp_init(&M[1])) != MP_OKAY) {
     return err;
  }

  /* now init the second half of the array */
  for (x = 1<<(winsize-1); x < (1 << winsize); x++) {
    if ((err = mp_init(&M[x])) != MP_OKAY) {
      for (y = 1<<(winsize-1); y < x; y++) {
        mp_clear (&M[y]);
      }
      mp_clear(&M[1]);
      return err;
    }
  }

  /* determine and setup reduction code */
  if (redmode == 0) {
     /* now setup montgomery  */
     if ((err = mp_montgomery_setup (P, &mp)) != MP_OKAY) {
        goto LBL_M;
     }

     /* automatically pick the comba one if available (saves quite a few calls/ifs) */
     if (((P->used * 2 + 1) < MP_WARRAY) &&
          P->used < (1 << ((CHAR_BIT * sizeof (mp_word)) - (2 * DIGIT_BIT)))) {
        redux = fast_mp_montgomery_reduce;
     } else 
     {
        /* use slower baseline Montgomery method */
        redux = mp_montgomery_reduce;
     }
  } else if (redmode == 1) {
     /* setup DR reduction for moduli of the form B**k - b */
     mp_dr_setup(P, &mp);
     redux = mp_dr_reduce;
  } else {
     /* setup DR reduction for moduli of the form 2**k - b */
     if ((err = mp_reduce_2k_setup(P, &mp)) != MP_OKAY) {
        goto LBL_M;
     }
     redux = mp_reduce_2k;
  }

  /* setup result */
  if ((err = mp_init (&res)) != MP_OKAY) {
    goto LBL_M;
  }

  /* create M table
   *

   *
   * The first half of the table is not computed though accept for M[0] and M[1]
   */

  if (redmode == 0) {
     /* now we need R mod m */
     if ((err = mp_montgomery_calc_normalization (&res, P)) != MP_OKAY) {
       goto LBL_RES;
     }

     /* now set M[1] to G * R mod m */
     if ((err = mp_mulmod (G, &res, P, &M[1])) != MP_OKAY) {
       goto LBL_RES;
     }
  } else {
     mp_set(&res, 1);
     if ((err = mp_mod(G, P, &M[1])) != MP_OKAY) {
        goto LBL_RES;
     }
  }

  /* compute the value at M[1<<(winsize-1)] by squaring M[1] (winsize-1) times */
  if ((err = mp_copy (&M[1], &M[1 << (winsize - 1)])) != MP_OKAY) {
    goto LBL_RES;
  }

  for (x = 0; x < (winsize - 1); x++) {
    if ((err = mp_sqr (&M[1 << (winsize - 1)], &M[1 << (winsize - 1)])) != MP_OKAY) {
      goto LBL_RES;
    }
    if ((err = redux (&M[1 << (winsize - 1)], P, mp)) != MP_OKAY) {
      goto LBL_RES;
    }
  }

  /* create upper table */
  for (x = (1 << (winsize - 1)) + 1; x < (1 << winsize); x++) {
    if ((err = mp_mul (&M[x - 1], &M[1], &M[x])) != MP_OKAY) {
      goto LBL_RES;
    }
    if ((err = redux (&M[x], P, mp)) != MP_OKAY) {
      goto LBL_RES;
    }
  }

  /* set initial mode and bit cnt */
  mode   = 0;
  bitcnt = 1;
  buf    = 0;
  digidx = X->used - 1;
  bitcpy = 0;
  bitbuf = 0;

  for (;;) {
    /* grab next digit as required */
    if (--bitcnt == 0) {
      /* if digidx == -1 we are out of digits so break */
      if (digidx == -1) {
        break;
      }
      /* read next digit and reset bitcnt */
      buf    = X->dp[digidx--];
      bitcnt = (int)DIGIT_BIT;
    }

    /* grab the next msb from the exponent */
    y     = (mp_digit)(buf >> (DIGIT_BIT - 1)) & 1;
    buf <<= (mp_digit)1;

    /* if the bit is zero and mode == 0 then we ignore it
     * These represent the leading zero bits before the first 1 bit
     * in the exponent.  Technically this opt is not required but it
     * does lower the # of trivial squaring/reductions used
     */
    if (mode == 0 && y == 0) {
      continue;
    }

    /* if the bit is zero and mode == 1 then we square */
    if (mode == 1 && y == 0) {
      if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, mp)) != MP_OKAY) {
        goto LBL_RES;
      }
      continue;
    }

    /* else we add it to the window */
    bitbuf |= (y << (winsize - ++bitcpy));
    mode    = 2;

    if (bitcpy == winsize) {
      /* ok window is filled so square as required and multiply  */
      /* square first */
      for (x = 0; x < winsize; x++) {
        if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
          goto LBL_RES;
        }
        if ((err = redux (&res, P, mp)) != MP_OKAY) {
          goto LBL_RES;
        }
      }

      /* then multiply */
      if ((err = mp_mul (&res, &M[bitbuf], &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, mp)) != MP_OKAY) {
        goto LBL_RES;
      }

      /* empty window and reset */
      bitcpy = 0;
      bitbuf = 0;
      mode   = 1;
    }
  }

  /* if bits remain then square/multiply */
  if (mode == 2 && bitcpy > 0) {
    /* square then multiply if the bit is set */
    for (x = 0; x < bitcpy; x++) {
      if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, mp)) != MP_OKAY) {
        goto LBL_RES;
      }

      /* get next bit of the window */
      bitbuf <<= 1;
      if ((bitbuf & (1 << winsize)) != 0) {
        /* then multiply */
        if ((err = mp_mul (&res, &M[1], &res)) != MP_OKAY) {
          goto LBL_RES;
        }
        if ((err = redux (&res, P, mp)) != MP_OKAY) {
          goto LBL_RES;
        }
      }
    }
  }

  if (redmode == 0) {
     /* fixup result if Montgomery reduction is used
      * recall that any value in a Montgomery system is
      * actually multiplied by R mod n.  So we have
      * to reduce one more time to cancel out the factor
      * of R.
      */
     if ((err = redux(&res, P, mp)) != MP_OKAY) {
       goto LBL_RES;
     }
  }

  /* swap res with Y */
  mp_exch (&res, Y);
  err = MP_OKAY;
LBL_RES:mp_clear (&res);
LBL_M:
  mp_clear(&M[1]);
  for (x = 1<<(winsize-1); x < (1 << winsize); x++) {
    mp_clear (&M[x]);
  }
  return err;
}